

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

void __thiscall leveldb::_Test_DBOpen_Options::_Run(_Test_DBOpen_Options *this)

{
  char *pcVar1;
  Tester local_e90;
  Tester local_cf0;
  DB local_b50;
  Tester local_b48;
  Status local_9a8 [4];
  Tester local_988;
  DB local_7e8;
  Tester local_7e0;
  Tester local_640;
  DB local_4a0;
  Tester local_498;
  Status local_2f8 [4];
  Tester local_2d8;
  DB local_138;
  Status s;
  Options opts;
  DB *db;
  Status local_68 [3];
  string local_50 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30 [8];
  string dbname;
  _Test_DBOpen_Options *this_local;
  
  test::TmpDir_abi_cxx11_();
  std::operator+(local_30,(char *)local_50);
  std::__cxx11::string::~string(local_50);
  Options::Options((Options *)&db);
  DestroyDB((leveldb *)local_68,local_30,(Options *)&db);
  Status::~Status(local_68);
  opts.filter_policy = (FilterPolicy *)0x0;
  Options::Options((Options *)&s);
  opts.comparator._0_1_ = 0;
  DB::Open(&local_138,(Options *)&s,local_30,(DB **)&opts.filter_policy);
  test::Tester::Tester
            (&local_2d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x65a);
  Status::ToString_abi_cxx11_(local_2f8);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  pcVar1 = strstr(pcVar1,"does not exist");
  test::Tester::Is(&local_2d8,pcVar1 != (char *)0x0,
                   "strstr(s.ToString().c_str(), \"does not exist\") != nullptr");
  std::__cxx11::string::~string((string *)local_2f8);
  test::Tester::~Tester(&local_2d8);
  test::Tester::Tester
            (&local_498,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x65b);
  test::Tester::Is(&local_498,opts.filter_policy == (FilterPolicy *)0x0,"db == nullptr");
  test::Tester::~Tester(&local_498);
  opts.comparator._0_1_ = 1;
  DB::Open(&local_4a0,(Options *)&s,local_30,(DB **)&opts.filter_policy);
  Status::operator=((Status *)&local_138,(Status *)&local_4a0);
  Status::~Status((Status *)&local_4a0);
  test::Tester::Tester
            (&local_640,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x660);
  test::Tester::IsOk(&local_640,(Status *)&local_138);
  test::Tester::~Tester(&local_640);
  test::Tester::Tester
            (&local_7e0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x661);
  test::Tester::Is(&local_7e0,opts.filter_policy != (FilterPolicy *)0x0,"db != nullptr");
  test::Tester::~Tester(&local_7e0);
  if (opts.filter_policy != (FilterPolicy *)0x0) {
    (*(opts.filter_policy)->_vptr_FilterPolicy[1])();
  }
  opts.filter_policy = (FilterPolicy *)0x0;
  opts.comparator._0_1_ = 0;
  opts.comparator._1_1_ = 1;
  DB::Open(&local_7e8,(Options *)&s,local_30,(DB **)&opts.filter_policy);
  Status::operator=((Status *)&local_138,(Status *)&local_7e8);
  Status::~Status((Status *)&local_7e8);
  test::Tester::Tester
            (&local_988,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x66a);
  Status::ToString_abi_cxx11_(local_9a8);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  pcVar1 = strstr(pcVar1,"exists");
  test::Tester::Is(&local_988,pcVar1 != (char *)0x0,
                   "strstr(s.ToString().c_str(), \"exists\") != nullptr");
  std::__cxx11::string::~string((string *)local_9a8);
  test::Tester::~Tester(&local_988);
  test::Tester::Tester
            (&local_b48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x66b);
  test::Tester::Is(&local_b48,opts.filter_policy == (FilterPolicy *)0x0,"db == nullptr");
  test::Tester::~Tester(&local_b48);
  opts.comparator._0_1_ = 1;
  opts.comparator._1_1_ = 0;
  DB::Open(&local_b50,(Options *)&s,local_30,(DB **)&opts.filter_policy);
  Status::operator=((Status *)&local_138,(Status *)&local_b50);
  Status::~Status((Status *)&local_b50);
  test::Tester::Tester
            (&local_cf0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x671);
  test::Tester::IsOk(&local_cf0,(Status *)&local_138);
  test::Tester::~Tester(&local_cf0);
  test::Tester::Tester
            (&local_e90,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x672);
  test::Tester::Is(&local_e90,opts.filter_policy != (FilterPolicy *)0x0,"db != nullptr");
  test::Tester::~Tester(&local_e90);
  if (opts.filter_policy != (FilterPolicy *)0x0) {
    (*(opts.filter_policy)->_vptr_FilterPolicy[1])();
  }
  opts.filter_policy = (FilterPolicy *)0x0;
  Status::~Status((Status *)&local_138);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(DBTest, DBOpen_Options) {
  std::string dbname = test::TmpDir() + "/db_options_test";
  DestroyDB(dbname, Options());

  // Does not exist, and create_if_missing == false: error
  DB* db = nullptr;
  Options opts;
  opts.create_if_missing = false;
  Status s = DB::Open(opts, dbname, &db);
  ASSERT_TRUE(strstr(s.ToString().c_str(), "does not exist") != nullptr);
  ASSERT_TRUE(db == nullptr);

  // Does not exist, and create_if_missing == true: OK
  opts.create_if_missing = true;
  s = DB::Open(opts, dbname, &db);
  ASSERT_OK(s);
  ASSERT_TRUE(db != nullptr);

  delete db;
  db = nullptr;

  // Does exist, and error_if_exists == true: error
  opts.create_if_missing = false;
  opts.error_if_exists = true;
  s = DB::Open(opts, dbname, &db);
  ASSERT_TRUE(strstr(s.ToString().c_str(), "exists") != nullptr);
  ASSERT_TRUE(db == nullptr);

  // Does exist, and error_if_exists == false: OK
  opts.create_if_missing = true;
  opts.error_if_exists = false;
  s = DB::Open(opts, dbname, &db);
  ASSERT_OK(s);
  ASSERT_TRUE(db != nullptr);

  delete db;
  db = nullptr;
}